

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_DownCastMessageInvalidReferenceType_Test::TestBody
          (LiteTest_DownCastMessageInvalidReferenceType_Test *this)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  int iVar3;
  char *message;
  long lVar4;
  StringLike<std::__cxx11::basic_string<char>_> *regex;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var5;
  AlphaNum *in_R9;
  DeathTest *gtest_dt;
  CastType1 test_type_1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_488;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_480;
  char *local_478;
  string local_450;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_430;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_418;
  AlphaNum local_400;
  AlphaNum local_3d0;
  AlphaNum local_3a0;
  TestAllTypesLite local_370;
  
  proto2_unittest::TestAllTypesLite::TestAllTypesLite(&local_370,(Arena *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_480._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10;
    local_478 = "Cannot downcast ";
    local_400.piece_ = MessageLite::GetTypeName(&local_370.super_MessageLite);
    local_3d0.piece_._M_len = 4;
    local_3d0.piece_._M_str = " to ";
    local_3a0.piece_ =
         MessageLite::GetTypeName
                   ((MessageLite *)&proto2_unittest::_TestPackedTypesLite_default_instance_);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_450,(lts_20250127 *)&local_480,&local_400,&local_3d0,&local_3a0,in_R9);
    testing::ContainsRegex<std::__cxx11::string>(&local_418,(testing *)&local_450,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_430,(PolymorphicMatcher *)&local_418);
    if (local_418.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_418.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("DownCastMessage<CastType2>(test_type_1_pointer)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_430,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
                       ,0x5b1,(DeathTest **)&local_488);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_430);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    _Var5._M_head_impl = local_488;
    if (!bVar2) goto LAB_0016c54d;
    if (local_488 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0016c5ac;
    iVar3 = (**(code **)(*(long *)local_488 + 0x10))(local_488);
    pbVar1 = local_488;
    if (iVar3 == 0) {
      iVar3 = (**(code **)(*(long *)local_488 + 0x18))(local_488);
      bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
      iVar3 = (**(code **)(*(long *)local_488 + 0x20))(local_488,(ulong)bVar2);
      if ((char)iVar3 == '\0') {
        (**(code **)(*(long *)_Var5._M_head_impl + 8))(_Var5._M_head_impl);
        goto LAB_0016c54d;
      }
    }
    else if (iVar3 == 1) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        DownCastMessage<proto2_unittest::TestPackedTypesLite>(&local_370.super_MessageLite);
      }
      (**(code **)(*(long *)local_488 + 0x28))(local_488,2);
      (**(code **)(*(long *)pbVar1 + 0x28))(pbVar1,0);
    }
    lVar4 = *(long *)_Var5._M_head_impl;
  }
  else {
LAB_0016c54d:
    testing::Message::Message((Message *)&local_480);
    message = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_400,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x5b1,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_400,(Message *)&local_480);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_400);
    if (local_480._M_head_impl ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0016c5ac;
    lVar4 = *(long *)local_480._M_head_impl;
    _Var5._M_head_impl = local_480._M_head_impl;
  }
  (**(code **)(lVar4 + 8))(_Var5._M_head_impl);
LAB_0016c5ac:
  proto2_unittest::TestAllTypesLite::~TestAllTypesLite(&local_370);
  return;
}

Assistant:

TEST(LiteTest, DownCastMessageInvalidReferenceType) {
  CastType1 test_type_1;

  MessageLite& test_type_1_pointer = test_type_1;

  ASSERT_DEBUG_DEATH(
      DownCastMessage<CastType2>(test_type_1_pointer),
      absl::StrCat("Cannot downcast ", test_type_1.GetTypeName(), " to ",
                   CastType2::default_instance().GetTypeName()));
}